

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O2

void Sbd_StoComputeCutsObj(Sbd_Sto_t *p,int iObj,int Delay,int Level)

{
  Vec_Wec_t *pVVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  pVVar2 = p->vDelays;
  if (iObj < pVVar2->nSize) {
    Vec_IntWriteEntry(pVVar2,iObj,Delay);
    Vec_IntWriteEntry(p->vLevels,iObj,Level);
    return;
  }
  if (pVVar2->nSize != iObj) {
    __assert_fail("iObj == Vec_IntSize(p->vDelays)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2c7,"void Sbd_StoComputeCutsObj(Sbd_Sto_t *, int, int, int)");
  }
  if (p->vLevels->nSize != iObj) {
    __assert_fail("iObj == Vec_IntSize(p->vLevels)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2c8,"void Sbd_StoComputeCutsObj(Sbd_Sto_t *, int, int, int)");
  }
  if (p->vCuts->nSize == iObj) {
    Vec_IntPush(pVVar2,Delay);
    Vec_IntPush(p->vLevels,Level);
    pVVar1 = p->vCuts;
    iVar5 = pVVar1->nSize;
    if (iVar5 == pVVar1->nCap) {
      uVar4 = 0x10;
      if (0xf < iVar5) {
        uVar4 = iVar5 * 2;
      }
      if (iVar5 < (int)uVar4) {
        if (pVVar1->pArray == (Vec_Int_t *)0x0) {
          pVVar2 = (Vec_Int_t *)malloc((ulong)uVar4 << 4);
          iVar3 = iVar5;
        }
        else {
          pVVar2 = (Vec_Int_t *)realloc(pVVar1->pArray,(ulong)uVar4 << 4);
          iVar5 = pVVar1->nSize;
          iVar3 = pVVar1->nCap;
        }
        pVVar1->pArray = pVVar2;
        memset(pVVar2 + iVar3,0,(long)(int)(uVar4 - iVar3) << 4);
        pVVar1->nCap = uVar4;
      }
    }
    pVVar1->nSize = iVar5 + 1;
    if (-1 < iVar5) {
      return;
    }
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
  }
  __assert_fail("iObj == Vec_WecSize(p->vCuts)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                ,0x2c9,"void Sbd_StoComputeCutsObj(Sbd_Sto_t *, int, int, int)");
}

Assistant:

void Sbd_StoComputeCutsObj( Sbd_Sto_t * p, int iObj, int Delay, int Level )
{
    if ( iObj < Vec_IntSize(p->vDelays) )
    {
        Vec_IntWriteEntry( p->vDelays, iObj, Delay );
        Vec_IntWriteEntry( p->vLevels, iObj, Level );
    }
    else
    {
        assert( iObj == Vec_IntSize(p->vDelays) );
        assert( iObj == Vec_IntSize(p->vLevels) );
        assert( iObj == Vec_WecSize(p->vCuts) );
        Vec_IntPush( p->vDelays, Delay );
        Vec_IntPush( p->vLevels, Level );
        Vec_WecPushLevel( p->vCuts );
    }
}